

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_orient_twod(REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  REF_CELL pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL valid;
  REF_INT nodes [27];
  int local_30;
  int local_2c;
  REF_INT cell_node;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  pRVar1 = ref_grid->cell[3];
  for (local_2c = 0; local_2c < pRVar1->max; local_2c = local_2c + 1) {
    RVar2 = ref_cell_nodes(pRVar1,local_2c,&ref_private_macro_code_rss);
    if (RVar2 == 0) {
      uVar3 = ref_node_tri_twod_orientation
                        (ref_node_00,&ref_private_macro_code_rss,&ref_private_macro_code_rss_1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x30f,"ref_grid_orient_twod",(ulong)uVar3,"valid");
        return uVar3;
      }
      if (ref_private_macro_code_rss_1 == 0) {
        for (local_30 = 0; local_30 < pRVar1->node_per; local_30 = local_30 + 1) {
          pRVar1->c2n[local_30 + pRVar1->size_per * local_2c] =
               (&ref_private_macro_code_rss)[(pRVar1->node_per + -1) - local_30];
        }
      }
    }
  }
  pRVar1 = ref_grid->cell[6];
  for (local_2c = 0; local_2c < pRVar1->max; local_2c = local_2c + 1) {
    RVar2 = ref_cell_nodes(pRVar1,local_2c,&ref_private_macro_code_rss);
    if (RVar2 == 0) {
      uVar3 = ref_node_tri_twod_orientation
                        (ref_node_00,&ref_private_macro_code_rss,&ref_private_macro_code_rss_1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x31a,"ref_grid_orient_twod",(ulong)uVar3,"valid");
        return uVar3;
      }
      if (ref_private_macro_code_rss_1 == 0) {
        for (local_30 = 0; local_30 < pRVar1->node_per; local_30 = local_30 + 1) {
          pRVar1->c2n[local_30 + pRVar1->size_per * local_2c] =
               (&ref_private_macro_code_rss)[(pRVar1->node_per + -1) - local_30];
        }
      }
    }
  }
  pRVar1 = ref_grid->cell[0];
  local_2c = 0;
  do {
    if (pRVar1->max <= local_2c) {
      return 0;
    }
    RVar2 = ref_cell_nodes(pRVar1,local_2c,&ref_private_macro_code_rss);
    if (RVar2 == 0) {
      uVar3 = ref_grid_orient_edg(ref_grid,&ref_private_macro_code_rss);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x325,"ref_grid_orient_twod",(ulong)uVar3,"orient_edge");
        return uVar3;
      }
      for (local_30 = 0; local_30 < pRVar1->node_per; local_30 = local_30 + 1) {
        pRVar1->c2n[local_30 + pRVar1->size_per * local_2c] =
             (&ref_private_macro_code_rss)[local_30];
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_grid_orient_twod(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL valid;
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) {
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_cell_c2n(ref_cell, cell_node, cell) =
            nodes[ref_cell_node_per(ref_cell) - 1 - cell_node];
      }
    }
  }
  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    /* uses tri formed from first three nodes of quad for orientation */
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) {
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_cell_c2n(ref_cell, cell_node, cell) =
            nodes[ref_cell_node_per(ref_cell) - 1 - cell_node];
      }
    }
  }
  /* orient edge after tri and quad sorted to use them as reference */
  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_grid_orient_edg(ref_grid, nodes), "orient_edge");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      ref_cell_c2n(ref_cell, cell_node, cell) = nodes[cell_node];
    }
  }
  return REF_SUCCESS;
}